

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void fasttext::averageRowsFast<32u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  undefined1 (*pauVar1) [64];
  float *pfVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  
  auVar11 = in_ZMM0._0_16_;
  pauVar1 = (undefined1 (*) [64])(x->data_).mem_;
  if (((ulong)pauVar1 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
                 );
  }
  pfVar2 = (matrix->data_).mem_;
  if (((ulong)pfVar2 & 0x3f) == 0) {
    piVar3 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar3 != piVar4) {
      lVar5 = (matrix->super_Matrix).n_;
      lVar6 = *piVar3 * lVar5;
      auVar8 = *(undefined1 (*) [64])(pfVar2 + lVar6);
      auVar9 = *(undefined1 (*) [64])(pfVar2 + lVar6 + 0x10);
      piVar7 = piVar3;
      while (piVar7 = piVar7 + 1, piVar7 != piVar4) {
        lVar6 = *piVar7 * lVar5;
        auVar8 = vaddps_avx512f(auVar8,*(undefined1 (*) [64])(pfVar2 + lVar6));
        auVar9 = vaddps_avx512f(auVar9,*(undefined1 (*) [64])(pfVar2 + lVar6 + 0x10));
      }
      auVar11 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,(long)piVar4 - (long)piVar3 >> 2);
      auVar11._0_8_ = 1.0 / auVar11._0_8_;
      auVar11._8_8_ = 0x3ff0000000000000;
      auVar12._0_4_ = (float)auVar11._0_8_;
      auVar12._4_12_ = auVar11._4_12_;
      auVar10 = vbroadcastss_avx512f(auVar12);
      auVar8 = vmulps_avx512f(auVar10,auVar8);
      auVar9 = vmulps_avx512f(auVar10,auVar9);
      *pauVar1 = auVar8;
      *(undefined1 (*) [64])((x->data_).mem_ + 0x10) = auVar9;
      return;
    }
    Vector::zero(x);
    auVar11 = vcvtusi2sd_avx512f(auVar11,(long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar11._0_8_));
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0xb4,
                "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
               );
}

Assistant:

void DenseMatrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}